

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_send_start(ipc_pipe *p)

{
  nni_list *list;
  _Bool _Var1;
  nni_aio *aio;
  nni_msg *m;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  void *pvVar5;
  uint nio;
  undefined1 local_58 [8];
  nni_iov iov [3];
  
  _Var1 = p->closed;
  list = &p->send_q;
  aio = (nni_aio *)nni_list_first(list);
  if (_Var1 == true) {
    while (aio != (nni_aio *)0x0) {
      nni_list_remove(list,aio);
      nni_aio_finish_error(aio,NNG_ECLOSED);
      aio = (nni_aio *)nni_list_first(list);
    }
  }
  else if (aio != (nni_aio *)0x0) {
    m = nni_aio_get_msg(aio);
    sVar2 = nni_msg_len(m);
    sVar3 = nni_msg_header_len(m);
    lVar4 = sVar3 + sVar2;
    local_58 = (undefined1  [8])p->tx_head;
    p->tx_head[0] = '\x01';
    p->tx_head[1] = (uint8_t)((ulong)lVar4 >> 0x38);
    p->tx_head[2] = (uint8_t)((ulong)lVar4 >> 0x30);
    p->tx_head[3] = (uint8_t)((ulong)lVar4 >> 0x28);
    p->tx_head[4] = (uint8_t)((ulong)lVar4 >> 0x20);
    p->tx_head[5] = (uint8_t)((ulong)lVar4 >> 0x18);
    p->tx_head[6] = (uint8_t)((ulong)lVar4 >> 0x10);
    p->tx_head[7] = (uint8_t)((ulong)lVar4 >> 8);
    p->tx_head[8] = (uint8_t)lVar4;
    iov[0].iov_buf = (void *)0x9;
    sVar2 = nni_msg_header_len(m);
    if (sVar2 == 0) {
      nio = 1;
    }
    else {
      iov[0].iov_len = (size_t)nni_msg_header(m);
      iov[1].iov_buf = (void *)nni_msg_header_len(m);
      nio = 2;
    }
    sVar2 = nni_msg_len(m);
    if (sVar2 != 0) {
      pvVar5 = nni_msg_body(m);
      *(void **)((long)iov + ((ulong)(nio << 4) - 8)) = pvVar5;
      sVar2 = nni_msg_len(m);
      *(size_t *)((long)&iov[0].iov_buf + (ulong)(nio << 4)) = sVar2;
      nio = nio + 1;
    }
    nni_aio_set_iov(&p->tx_aio,nio,(nni_iov *)local_58);
    nng_stream_send(p->conn,&p->tx_aio);
  }
  return;
}

Assistant:

static void
ipc_pipe_send_start(ipc_pipe *p)
{
	nni_aio *aio;
	nni_msg *msg;
	int      nio;
	nni_iov  iov[3];
	uint64_t len;

	if (p->closed) {
		while ((aio = nni_list_first(&p->send_q)) != NULL) {
			nni_list_remove(&p->send_q, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}
	if ((aio = nni_list_first(&p->send_q)) == NULL) {
		return;
	}

	// This runs to send the message.
	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg) + nni_msg_header_len(msg);

	p->tx_head[0] = 1; // message type, 1.
	NNI_PUT64(p->tx_head + 1, len);

	nio            = 0;
	iov[0].iov_buf = p->tx_head;
	iov[0].iov_len = sizeof(p->tx_head);
	nio++;
	if (nni_msg_header_len(msg) > 0) {
		iov[nio].iov_buf = nni_msg_header(msg);
		iov[nio].iov_len = nni_msg_header_len(msg);
		nio++;
	}
	if (nni_msg_len(msg) > 0) {
		iov[nio].iov_buf = nni_msg_body(msg);
		iov[nio].iov_len = nni_msg_len(msg);
		nio++;
	}
	nni_aio_set_iov(&p->tx_aio, nio, iov);
	nng_stream_send(p->conn, &p->tx_aio);
}